

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::DefinePartition(TPZMHMeshControl *this,TPZVec<long> *partitionindex)

{
  TPZGeoMesh *pTVar1;
  TPZGeoEl *pTVar2;
  long lVar3;
  _func_int **pp_Var4;
  TPZGeoEl *pTVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  TPZGeoEl **ppTVar9;
  mapped_type *pmVar10;
  int iVar11;
  long nelem;
  int iVar12;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZGeoElSide neighbour_1;
  TPZGeoElBC bc;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  skeleton;
  pair<const_long,_std::pair<long,_long>_> local_e8;
  TPZMHMeshControl *local_d0;
  _func_int **local_c8;
  TPZGeoElSide local_c0;
  TPZVec<long> *local_a8;
  _func_int **local_a0;
  TPZGeoEl *local_98;
  int local_90;
  ulong local_88;
  TPZGeoElBC local_80;
  TPZChunkVector<TPZGeoEl_*,_10> *local_78;
  long local_70;
  TPZGeoEl *local_68;
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  local_60;
  
  pTVar1 = ((this->fGMesh).fRef)->fPointer;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = (pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  local_d0 = this;
  local_a8 = partitionindex;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < local_70) {
    local_88 = (ulong)(uint)pTVar1->fDim;
    local_78 = &(pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    iVar11 = pTVar1->fDim - 1;
    nelem = 0;
    local_c8 = (_func_int **)&PTR__TPZGeoElSide_01920090;
    do {
      ppTVar9 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_78,nelem);
      pTVar2 = *ppTVar9;
      iVar7 = (**(code **)(*(long *)pTVar2 + 0x1d0))(pTVar2);
      if (iVar7 == 0) {
        iVar7 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2);
        if (iVar7 == iVar11) {
          iVar7 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          (**(code **)(*(long *)pTVar2 + 0x188))(&local_e8,pTVar2,iVar7 + -1);
          iVar7 = (**(code **)(*(long *)local_e8.second.first + 0x210))();
          if (iVar7 != (int)local_88) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                       ,0x75);
          }
          lVar3 = local_a8->fStore[*(int64_t *)(local_e8.second.first + 0x30)];
          pp_Var4 = (_func_int **)pTVar2->fIndex;
          local_c0.super_TPZSavable._vptr_TPZSavable = pp_Var4;
          pmVar10 = std::
                    map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                    ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                  *)&local_60,(key_type_conflict1 *)&local_c0);
          pmVar10->first = (long)(int)lVar3;
          pmVar10->second = (long)pp_Var4;
        }
        else {
          iVar7 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          if (0 < iVar7) {
            iVar12 = 0;
            do {
              local_c0.super_TPZSavable._vptr_TPZSavable = local_c8;
              local_c0.fGeoEl = pTVar2;
              local_c0.fSide = iVar12;
              iVar8 = TPZGeoElSide::Dimension(&local_c0);
              if (iVar8 == iVar11) {
                if (local_c0.fGeoEl == (TPZGeoEl *)0x0) {
                  local_a0 = local_c8;
                  local_98 = (TPZGeoEl *)0x0;
                  local_90 = -1;
                }
                else {
                  (**(code **)(*(long *)local_c0.fGeoEl + 0x188))
                            (&local_a0,local_c0.fGeoEl,local_c0.fSide);
                }
                iVar8 = (**(code **)(*(long *)local_98 + 0x210))();
                if (iVar8 == (int)local_88) {
                  local_68 = (TPZGeoEl *)local_a8->fStore[pTVar2->fIndex];
                  pTVar5 = (TPZGeoEl *)local_a8->fStore[local_98->fIndex];
                  if (local_68 != pTVar5) {
                    if (local_c0.fGeoEl == (TPZGeoEl *)0x0) {
                      local_e8.first = (long)local_c8;
                      local_e8.second.first = 0;
                      local_e8.second.second = CONCAT44(local_e8.second.second._4_4_,0xffffffff);
                    }
                    else {
                      (**(code **)(*(long *)local_c0.fGeoEl + 0x188))
                                (&local_e8,local_c0.fGeoEl,local_c0.fSide);
                    }
                    local_90 = (int)local_e8.second.second;
                    local_98 = (TPZGeoEl *)local_e8.second.first;
                    bVar6 = (int)local_e8.second.second != local_c0.fSide ||
                            (TPZGeoEl *)local_e8.second.first != local_c0.fGeoEl;
                    if ((int)local_e8.second.second != local_c0.fSide ||
                        (TPZGeoEl *)local_e8.second.first != local_c0.fGeoEl) {
                      do {
                        local_98 = (TPZGeoEl *)local_e8.second.first;
                        if (*(int *)(local_e8.second.first + 0x18) == local_d0->fSkeletonMatId) {
                          if (bVar6) goto LAB_013b80cd;
                          break;
                        }
                        if ((TPZGeoEl *)local_e8.second.first == (TPZGeoEl *)0x0) {
                          local_e8.first = (long)local_c8;
                          local_e8.second.first = 0;
                          local_e8.second.second = CONCAT44(local_e8.second.second._4_4_,0xffffffff)
                          ;
                        }
                        else {
                          (**(code **)(*(long *)local_e8.second.first + 0x188))(&local_e8);
                        }
                        local_90 = (int)local_e8.second.second;
                        local_98 = (TPZGeoEl *)local_e8.second.first;
                        bVar6 = (int)local_e8.second.second != local_c0.fSide ||
                                (TPZGeoEl *)local_e8.second.first != local_c0.fGeoEl;
                      } while (bVar6);
                    }
                    local_e8.second.first = (long)local_98;
                    TPZGeoElBC::TPZGeoElBC(&local_80,&local_c0,local_d0->fSkeletonMatId);
                    if ((TPZGeoEl *)(local_80.fCreatedElement)->fIndex == pTVar5) {
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                                 ,0xa7);
                    }
                    local_e8.first = (local_80.fCreatedElement)->fIndex;
                    local_e8.second.first = (long)local_68;
                    local_e8.second.second = (long)pTVar5;
                    std::
                    _Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                    ::_M_insert_unique<std::pair<long_const,std::pair<long,long>>>
                              ((_Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                                *)&local_60,&local_e8);
                  }
                }
              }
LAB_013b80cd:
              iVar12 = iVar12 + 1;
            } while (iVar12 != iVar7);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != local_70);
  }
  DefinePartition(local_d0,local_a8,
                  (map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   *)&local_60);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void TPZMHMeshControl::DefinePartition(TPZVec<int64_t> &partitionindex) {

    TPZGeoMesh *gmesh = this->fGMesh.operator->();

    // Creates skeleton elements
    std::map<int64_t, std::pair<int64_t, int64_t>> skeleton;

    int dim = gmesh->Dimension();

    const int64_t nel = gmesh->NElements();
    for (int64_t iel = 0; iel < nel; iel++) {

        TPZGeoEl *gel = gmesh->Element(iel);

        if (gel->HasSubElement()) continue;
        if (gel->Dimension() == dim-1)
        {
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            TPZGeoElSide neighbour = gelside.Neighbour();
            if(neighbour.Element()->Dimension() != dim) DebugStop();
            int partition = partitionindex[neighbour.Element()->Index()];
            int64_t neighindex = neighbour.Element()->Index();
            auto val = std::pair<int64_t,int64_t>(partition,gel->Index());
            skeleton[gel->Index()] = val;
            continue;
        }

        // Iterates through the sides of the element
        int nsides = gel->NSides();

        for (int iside = 0; iside < nsides; iside++) {

            TPZGeoElSide gelside(gel, iside);

            // Filters boundary sides
            if (gelside.Dimension() != dim - 1) continue;

            TPZGeoElSide neighbour = gelside.Neighbour();

            // Filters neighbour sides that belong to volume elements
            if (neighbour.Element()->Dimension() != dim) continue;

            int64_t thisId = gel->Index();
            int64_t neighId = neighbour.Element()->Index();

            // This lambda checks if a skeleton has already been created over gelside
            auto hasSkeletonNeighbour = [&]() -> bool {
                neighbour = gelside.Neighbour();
                while (neighbour != gelside) {
                    int neighbourMatId = neighbour.Element()->MaterialId();
                    if (neighbourMatId == fSkeletonMatId) {
                        return true;
                    }
                   neighbour = neighbour.Neighbour();
                }
                return false;
            };

            int64_t thisGroup = partitionindex[thisId];
            int64_t neighGroup = partitionindex[neighId];

            if (thisGroup != neighGroup) {
                if (!hasSkeletonNeighbour()) {
                    TPZGeoElBC bc(gelside, fSkeletonMatId);
                    std::pair<int64_t, int64_t> adjacentGroupIndexes(thisGroup, neighGroup);
                    int64_t bc_index = bc.CreatedElement()->Index();
                    if(bc_index == neighGroup)
                    {
                        // you are unwillingly creating a boundary skeleton
                        DebugStop();
                    }
                    skeleton.insert({bc.CreatedElement()->Index(), adjacentGroupIndexes});
                }
            }
        }
    }

    DefinePartition(partitionindex, skeleton);
}